

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O2

URegistryKey __thiscall
icu_63::ICUService::registerFactory
          (ICUService *this,ICUServiceFactory *factoryToAdopt,UErrorCode *status)

{
  bool bVar1;
  UVector *this_00;
  ICUServiceFactory *size;
  Mutex mutex;
  
  if ((factoryToAdopt == (ICUServiceFactory *)0x0) || (U_ZERO_ERROR < *status)) goto LAB_0030be77;
  mutex.fMutex = (UMutex *)icu_63::lock;
  size = factoryToAdopt;
  umtx_lock_63((UMutex *)icu_63::lock);
  this_00 = this->factories;
  if (this_00 == (UVector *)0x0) {
    this_00 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)size);
    if (this_00 == (UVector *)0x0) {
      this->factories = (UVector *)0x0;
      if (U_ZERO_ERROR < *status) goto LAB_0030be66;
      goto LAB_0030bdeb;
    }
    UVector::UVector(this_00,deleteUObject,(UElementsAreEqual *)0x0,status);
    this->factories = this_00;
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_0030bdeb;
    (*(this_00->super_UObject)._vptr_UObject[1])(this_00);
LAB_0030be66:
    bVar1 = false;
  }
  else {
LAB_0030bdeb:
    UVector::insertElementAt(this_00,factoryToAdopt,0,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      bVar1 = true;
      (*(this->super_ICUNotifier)._vptr_ICUNotifier[0x12])(this);
    }
    else {
      (*(factoryToAdopt->super_UObject)._vptr_UObject[1])(factoryToAdopt);
      bVar1 = true;
      factoryToAdopt = (ICUServiceFactory *)0x0;
    }
  }
  Mutex::~Mutex(&mutex);
  if (!bVar1) {
    return (URegistryKey)0x0;
  }
LAB_0030be77:
  if (factoryToAdopt == (ICUServiceFactory *)0x0) {
    return (URegistryKey)0x0;
  }
  (*(this->super_ICUNotifier)._vptr_ICUNotifier[4])(this);
  return factoryToAdopt;
}

Assistant:

URegistryKey
ICUService::registerFactory(ICUServiceFactory* factoryToAdopt, UErrorCode& status) 
{
    if (U_SUCCESS(status) && factoryToAdopt != NULL) {
        Mutex mutex(&lock);

        if (factories == NULL) {
            factories = new UVector(deleteUObject, NULL, status);
            if (U_FAILURE(status)) {
                delete factories;
                return NULL;
            }
        }
        factories->insertElementAt(factoryToAdopt, 0, status);
        if (U_SUCCESS(status)) {
            clearCaches();
        } else {
            delete factoryToAdopt;
            factoryToAdopt = NULL;
        }
    }

    if (factoryToAdopt != NULL) {
        notifyChanged();
    }

    return (URegistryKey)factoryToAdopt;
}